

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_transaction.cpp
# Opt level: O2

RawTransactionResponseStruct *
cfd::js::api::ElementsTransactionStructApi::UpdateTxOutAmount
          (RawTransactionResponseStruct *__return_storage_ptr__,
          UpdateTxOutAmountRequestStruct *request)

{
  string *in_R8;
  allocator local_119;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::UpdateTxOutAmountRequestStruct_&)>
  local_f8;
  RawTransactionResponseStruct local_d8;
  
  RawTransactionResponseStruct::RawTransactionResponseStruct(__return_storage_ptr__);
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_100 = std::
              _Function_handler<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::UpdateTxOutAmountRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_transaction.cpp:1342:20)>
              ::_M_invoke;
  local_108 = std::
              _Function_handler<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::UpdateTxOutAmountRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_transaction.cpp:1342:20)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_f8,"UpdateTxOutAmount",&local_119);
  ExecuteStructApi<cfd::js::api::UpdateTxOutAmountRequestStruct,cfd::js::api::RawTransactionResponseStruct>
            (&local_d8,(api *)request,(UpdateTxOutAmountRequestStruct *)&local_118,&local_f8,in_R8);
  RawTransactionResponseStruct::operator=(__return_storage_ptr__,&local_d8);
  RawTransactionResponseStruct::~RawTransactionResponseStruct(&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_118);
  return __return_storage_ptr__;
}

Assistant:

RawTransactionResponseStruct ElementsTransactionStructApi::UpdateTxOutAmount(
    const UpdateTxOutAmountRequestStruct& request) {
  auto call_func = [](const UpdateTxOutAmountRequestStruct& request)
      -> RawTransactionResponseStruct {  // NOLINT
    RawTransactionResponseStruct response;

    ConfidentialTransactionContext ctx(request.tx);
    ElementsAddressFactory address_factory;
    for (auto& txout : request.txouts) {
      uint32_t index = txout.index;
      if (!txout.direct_locking_script.empty()) {
        index = ctx.GetTxOutIndex(Script(txout.direct_locking_script));
      } else if (!txout.address.empty()) {
        if (ElementsConfidentialAddress::IsConfidentialAddress(
                txout.address)) {
          ElementsConfidentialAddress confidential_addr(txout.address);
          index = ctx.GetTxOutIndex(confidential_addr.GetUnblindedAddress());
        } else {
          index = ctx.GetTxOutIndex(address_factory.GetAddress(txout.address));
        }
      }
      ctx.SetTxOutValue(index, Amount(txout.amount));
    }

    response.hex = ctx.GetHex();
    return response;
  };

  RawTransactionResponseStruct result;
  result = ExecuteStructApi<
      UpdateTxOutAmountRequestStruct, RawTransactionResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}